

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pXXX_YYY.cpp
# Opt level: O3

void pXXX_YYY(void)

{
  _List_node_base *p_Var1;
  initializer_list<int> __l;
  string problem_no;
  string base_path;
  list<int,_std::allocator<int>_> files_to_run;
  string local_78;
  string local_58;
  list<int,_std::allocator<int>_> local_38;
  
  local_58._M_dataplus._M_p = (pointer)0x200000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_58;
  std::__cxx11::list<int,_std::allocator<int>_>::list(&local_38,__l,(allocator_type *)&local_78);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"src/codewars/easy_puzzles","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"pXXX_YYY","");
  string_in_out_testing_v2(&local_58,&local_78,&local_38,pXXX_main);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  while (local_38.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
         _M_next != (_List_node_base *)&local_38) {
    p_Var1 = (((_List_base<int,_std::allocator<int>_> *)
              &(local_38.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
             _M_next;
    operator_delete(local_38.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next);
    local_38.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
    _M_next = p_Var1;
  }
  return;
}

Assistant:

void pXXX_YYY() {
    list<int> files_to_run = {1, 2};  // TODO: Specify which test-sets you want to run or leave empty to run all test-files found)
    const string base_path = "src/codewars/easy_puzzles";  // TODO: Change if necessary
    const string problem_no = "pXXX_YYY";
    string_in_out_testing_v2(base_path, problem_no, files_to_run, pXXX_main);
}